

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi_info_from_file(FILE *f,int *x,int *y,int *comp)

{
  int iVar1;
  long __off;
  stbi__context s;
  stbi__context local_100;
  
  __off = ftell((FILE *)f);
  stbi__start_callbacks(&local_100,&stbi__stdio_callbacks,f);
  iVar1 = stbi__info_main(&local_100,x,y,comp);
  fseek((FILE *)f,__off,0);
  return iVar1;
}

Assistant:

STBIDEF int stbi_info_from_file(FILE *f, int *x, int *y, int *comp)
{
   int r;
   stbi__context s;
   long pos = ftell(f);
   stbi__start_file(&s, f);
   r = stbi__info_main(&s,x,y,comp);
   fseek(f,pos,SEEK_SET);
   return r;
}